

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

void __thiscall Lexer::Lexer(Lexer *this,string *input)

{
  char *pcVar1;
  string *input_local;
  Lexer *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)input);
  pcVar1 = (char *)std::__cxx11::string::cbegin();
  (this->m_iter)._M_current = pcVar1;
  this->m_line = 1;
  return;
}

Assistant:

Lexer::Lexer(const std::string& input)
    : m_input(input)
    , m_iter(input.cbegin())
    , m_line(1)
{

}